

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

void ImGui::PushStyleColor(ImGuiCol idx,ImU32 col)

{
  undefined8 *puVar1;
  ImVec4 IVar2;
  undefined1 local_2c [8];
  ImGuiColorMod backup;
  ImGuiContext *g;
  ImU32 col_local;
  ImGuiCol idx_local;
  
  backup.BackupValue._8_8_ = GImGui;
  ImGuiColorMod::ImGuiColorMod((ImGuiColorMod *)local_2c);
  puVar1 = (undefined8 *)(backup.BackupValue._8_8_ + 0x1608 + (long)idx * 0x10);
  unique0x10000077 = *puVar1;
  backup.BackupValue._0_8_ = puVar1[1];
  local_2c._0_4_ = idx;
  ImVector<ImGuiColorMod>::push_back
            ((ImVector<ImGuiColorMod> *)(backup.BackupValue._8_8_ + 0x1b38),
             (ImGuiColorMod *)local_2c);
  IVar2 = ColorConvertU32ToFloat4(col);
  puVar1 = (undefined8 *)(backup.BackupValue._8_8_ + 0x1608 + (long)idx * 0x10);
  *puVar1 = IVar2._0_8_;
  puVar1[1] = IVar2._8_8_;
  return;
}

Assistant:

void ImGui::PushStyleColor(ImGuiCol idx, ImU32 col)
{
    ImGuiContext& g = *GImGui;
    ImGuiColorMod backup;
    backup.Col = idx;
    backup.BackupValue = g.Style.Colors[idx];
    g.ColorModifiers.push_back(backup);
    g.Style.Colors[idx] = ColorConvertU32ToFloat4(col);
}